

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::ObjReader::ParseFromFile(ObjReader *this,string *filename,ObjReaderConfig *config)

{
  byte bVar1;
  bool bVar2;
  long in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t pos;
  string mtl_search_path;
  undefined1 in_stack_000003be;
  undefined1 in_stack_000003bf;
  char *in_stack_000003c0;
  string *in_stack_000003c8;
  string *in_stack_000003d0;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *in_stack_000003d8;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *in_stack_000003e0;
  attrib_t *in_stack_000003e8;
  char *in_stack_00000400;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  string local_68 [32];
  long local_48;
  string local_40 [32];
  long local_20;
  char *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b0e1b);
  if (bVar2) {
    local_48 = std::__cxx11::string::find_last_of(local_18,0x42b85e);
    if (local_48 != -1) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      std::__cxx11::string::~string(local_68);
    }
  }
  else {
    std::__cxx11::string::operator=(local_40,(string *)(local_20 + 8));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  bVar2 = LoadObj(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,
                  in_stack_000003c8,in_stack_000003c0,in_stack_00000400,(bool)in_stack_000003bf,
                  (bool)in_stack_000003be);
  *(bool *)&(in_RDI->_M_dataplus)._M_p = bVar2;
  bVar1 = *(byte *)&(in_RDI->_M_dataplus)._M_p;
  std::__cxx11::string::~string(local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ObjReader::ParseFromFile(const std::string &filename,
                              const ObjReaderConfig &config) {
  std::string mtl_search_path;

  if (config.mtl_search_path.empty()) {
    //
    // split at last '/'(for unixish system) or '\\'(for windows) to get
    // the base directory of .obj file
    //
    size_t pos = filename.find_last_of("/\\");
    if (pos != std::string::npos) {
      mtl_search_path = filename.substr(0, pos);
    }
  } else {
    mtl_search_path = config.mtl_search_path;
  }

  valid_ = LoadObj(&attrib_, &shapes_, &materials_, &warning_, &error_,
                   filename.c_str(), mtl_search_path.c_str(),
                   config.triangulate, config.vertex_color);

  return valid_;
}